

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall
BailOutRecord::RestoreValues
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,uint count,
          int *offsets,int argOutSlotStart,Var *values,ScriptContext *scriptContext,
          bool fromLoopBody,Var *registerSaves,InterpreterStackFrame *newInstance,
          Var *pArgumentsObject,void *argoutRestoreAddress)

{
  int iVar1;
  uint uVar2;
  GlobalBailOutRecordDataTable *pGVar3;
  GlobalBailOutRecordDataRow *pGVar4;
  code *pcVar5;
  byte bVar6;
  bool bVar7;
  undefined4 *puVar8;
  ulong uVar9;
  long lVar10;
  uint32 uVar11;
  bool local_32;
  bool local_31 [7];
  bool isFloat64;
  bool isInt32;
  
  if (offsets == (int *)0x0) {
    pGVar3 = this->globalBailOutRecordTable;
    uVar11 = pGVar3->length;
    if (uVar11 != 0) {
      uVar2 = this->m_bailOutRecordId;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar10 = 0;
      uVar9 = 0;
      do {
        pGVar4 = pGVar3->globalBailOutRecordDataRows;
        if (uVar2 <= *(uint *)((long)&pGVar4->end + lVar10)) {
          if (uVar2 < *(uint *)((long)&pGVar4->start + lVar10)) {
            return;
          }
          iVar1 = *(int *)((long)&pGVar4->offset + lVar10);
          if (iVar1 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x411,"(row->offset != 0)","row->offset != 0");
            if (!bVar7) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar8 = 0;
            iVar1 = *(int *)((long)&pGVar4->offset + lVar10);
          }
          bVar6 = (byte)(*(uint *)(&pGVar4->field_0xc + lVar10) >> 0x18);
          RestoreValue(this,bailOutKind,layout,values,scriptContext,fromLoopBody,registerSaves,
                       newInstance,pArgumentsObject,argoutRestoreAddress,
                       *(uint *)(&pGVar4->field_0xc + lVar10) & 0x3fffffff,iVar1,true,
                       (bool)(bVar6 >> 6 & 1),(bool)(bVar6 >> 7));
          uVar11 = pGVar3->length;
        }
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar9 < uVar11);
    }
  }
  else if (count != 0) {
    uVar9 = 0;
    do {
      iVar1 = offsets[uVar9];
      IsOffsetNativeIntOrFloat(this,(uint)uVar9,argOutSlotStart,&local_32,local_31);
      RestoreValue(this,bailOutKind,layout,values,scriptContext,fromLoopBody,registerSaves,
                   newInstance,pArgumentsObject,argoutRestoreAddress,(uint)uVar9,iVar1,false,
                   local_32,local_31[0]);
      uVar9 = uVar9 + 1;
    } while (count != uVar9);
  }
  return;
}

Assistant:

void
BailOutRecord::RestoreValues(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, uint count, __in_ecount_opt(count) int * offsets, int argOutSlotStart,
    __out_ecount(count) Js::Var * values, Js::ScriptContext * scriptContext,
    bool fromLoopBody, Js::Var * registerSaves, Js::InterpreterStackFrame * newInstance, Js::Var* pArgumentsObject, void * argoutRestoreAddress) const
{
    bool isLocal = offsets == nullptr;

    if (isLocal == true)
    {
        globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
            Assert(row->offset != 0);
            RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                argoutRestoreAddress, row->regSlot, row->offset, true, row->isFloat, row->isInt);
        });
    }
    else
    {
        for (uint i = 0; i < count; i++)
        {
            int offset = 0;

            // The variables below determine whether we have a Var or native float/int.
            bool isFloat64;
            bool isInt32;

            offset = offsets[i];
            this->IsOffsetNativeIntOrFloat(i, argOutSlotStart, &isFloat64, &isInt32);
#ifdef _M_IX86
            if (this->argOutOffsetInfo->isOrphanedArgSlot->Test(argOutSlotStart + i))
            {
                RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                    nullptr, i, offset, /* isLocal */ true, isFloat64, isInt32);
                continue;
            }
#endif
            RestoreValue(bailOutKind, layout, values, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject,
                         argoutRestoreAddress, i, offset, false, isFloat64, isInt32);
        }
    }
}